

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmInvMont(word *b,word *a,qr_o *r,void *stack)

{
  size_t sVar1;
  
  for (sVar1 = zzAlmostInvMod(b,a,r->mod,r->n,stack); sVar1 < r->n << 7; sVar1 = sVar1 + 1) {
    zzDoubleMod(b,b,r->mod,r->n);
  }
  return;
}

Assistant:

static void zmInvMont(word b[], const word a[], const qr_o* r, void* stack)
{
	register size_t k;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	// b <- a^{-1} 2^k \mod mod
	k = zzAlmostInvMod(b, a, r->mod, r->n, stack);
	ASSERT(wwBitSize(r->mod, r->n) <= k);
	ASSERT(k <= 2 * wwBitSize(r->mod, r->n));
	// b <- a^{-1} R^2 \mod mod
	for (; k < 2 * r->n * B_PER_W; ++k)
		zzDoubleMod(b, b, r->mod, r->n);
}